

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
* __thiscall
mario::TimerQueue::getExpired
          (vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           *__return_storage_ptr__,TimerQueue *this,Timestamp now)

{
  bool bVar1;
  iterator __last;
  iterator iVar2;
  back_insert_iterator<std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
  __result;
  reference ppVar3;
  Timer **__y;
  size_type n;
  undefined1 local_c8 [8];
  ActiveTimer timer;
  pair<mario::Timestamp,_mario::Timer_*> entry;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  *__range1;
  iterator it;
  Timestamp local_40;
  undefined1 local_38 [8];
  pair<mario::Timestamp,_mario::Timer_*> sentry;
  TimerQueue *this_local;
  Timestamp now_local;
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  *expired;
  
  sentry.second._7_1_ = 0;
  this_local = (TimerQueue *)now._microSecondsSinceEpoch;
  now_local._microSecondsSinceEpoch = (int64_t)__return_storage_ptr__;
  std::
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  ::vector(__return_storage_ptr__);
  local_40._microSecondsSinceEpoch = -1;
  local_38 = (undefined1  [8])
             std::make_pair<mario::Timestamp&,mario::Timer*>
                       ((pair<mario::Timestamp,_mario::Timer_*> *)&this_local,&local_40,__y);
  __last = std::
           set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           ::lower_bound(&this->_timers,(key_type *)local_38);
  iVar2 = std::
          set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
          ::begin(&this->_timers);
  __result = std::
             back_inserter<std::vector<std::pair<mario::Timestamp,mario::Timer*>,std::allocator<std::pair<mario::Timestamp,mario::Timer*>>>>
                       (__return_storage_ptr__);
  std::
  copy<std::_Rb_tree_const_iterator<std::pair<mario::Timestamp,mario::Timer*>>,std::back_insert_iterator<std::vector<std::pair<mario::Timestamp,mario::Timer*>,std::allocator<std::pair<mario::Timestamp,mario::Timer*>>>>>
            ((_Rb_tree_const_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_>)iVar2._M_node,
             (_Rb_tree_const_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_>)__last._M_node,
             __result);
  iVar2 = std::
          set<std::pair<mario::Timestamp,_mario::Timer_*>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
          ::begin(&this->_timers);
  std::
  set<std::pair<mario::Timestamp,mario::Timer*>,std::less<std::pair<mario::Timestamp,mario::Timer*>>,std::allocator<std::pair<mario::Timestamp,mario::Timer*>>>
  ::erase_abi_cxx11_((set<std::pair<mario::Timestamp,mario::Timer*>,std::less<std::pair<mario::Timestamp,mario::Timer*>>,std::allocator<std::pair<mario::Timestamp,mario::Timer*>>>
                      *)&this->_timers,(const_iterator)iVar2._M_node,(const_iterator)__last._M_node)
  ;
  __end1 = std::
           vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           ::begin(__return_storage_ptr__);
  entry.second = (Timer *)std::
                          vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
                          ::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
                                     *)&entry.second), bVar1) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
             ::operator*(&__end1);
    timer.second = (ppVar3->first)._microSecondsSinceEpoch;
    entry.first._microSecondsSinceEpoch = (int64_t)ppVar3->second;
    n = Timer::sequence((Timer *)entry.first._microSecondsSinceEpoch);
    std::pair<mario::Timer_*,_long>::pair<mario::Timer_*&,_long,_true>
              ((pair<mario::Timer_*,_long> *)local_c8,(Timer **)&entry,(long *)&n);
    std::
    set<std::pair<mario::Timer_*,_long>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
    ::erase(&this->_activeTimers,(key_type *)local_c8);
    __gnu_cxx::
    __normal_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_*,_std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TimerQueue::Entry> TimerQueue::getExpired(Timestamp now) {
    std::vector<Entry> expired;
    auto sentry = std::make_pair(now, reinterpret_cast<Timer*>(UINTPTR_MAX));
    auto it = _timers.lower_bound(sentry);
    std::copy(_timers.begin(), it, back_inserter(expired));
    _timers.erase(_timers.begin(), it);

    for (auto entry : expired) {
        ActiveTimer timer(entry.second, entry.second->sequence());
        auto n = _activeTimers.erase(timer);
    }

    return expired;
}